

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.h
# Opt level: O0

void __thiscall Histogram::Histogram(Histogram *this,double base)

{
  void *pvVar1;
  atomic<unsigned_long> *in_RDI;
  __atomic_base<unsigned_long> *in_XMM0_Qa;
  double dVar2;
  size_t i;
  __integral_type in_stack_ffffffffffffffd8;
  ulong __i;
  
  (in_RDI->super___atomic_base<unsigned_long>)._M_i = (__int_type)in_XMM0_Qa;
  dVar2 = log((double)in_XMM0_Qa);
  in_RDI[1].super___atomic_base<unsigned_long>._M_i = (__int_type)dVar2;
  std::atomic<unsigned_long>::atomic(in_RDI,in_stack_ffffffffffffffd8);
  std::atomic<unsigned_long>::atomic(in_RDI,in_stack_ffffffffffffffd8);
  std::atomic<unsigned_long>::atomic(in_RDI,in_stack_ffffffffffffffd8);
  pvVar1 = operator_new__(0x208);
  in_RDI[2].super___atomic_base<unsigned_long>._M_i = (__int_type)pvVar1;
  for (__i = 0; __i < 0x41; __i = __i + 1) {
    std::__atomic_base<unsigned_long>::operator=(in_XMM0_Qa,__i);
  }
  return;
}

Assistant:

Histogram(double base = 2.0)
        : EXP_BASE(base)
        , EXP_BASE_LOG( log(base) )
        , count(0)
        , sum(0)
        , max(0)
    {
        bins = new HistBin[MAX_BINS];
        for (size_t i=0; i<MAX_BINS; ++i) {
            bins[i] = 0;
        }
    }